

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeemitter.cpp
# Opt level: O1

Error __thiscall asmjit::CodeEmitter::onDetach(CodeEmitter *this,CodeHolder *code)

{
  (this->_codeInfo)._archInfo = (anon_union_4_2_424c626f_for_ArchInfo_0)0x0;
  (this->_codeInfo).field_1 = (anon_union_4_2_314a35c9_for_CodeInfo_1)0x0;
  (this->_codeInfo)._baseAddress = 0xffffffffffffffff;
  this->_finalized = '\0';
  this->_lastError = 6;
  this->_privateData = 0;
  this->_globalHints = 0;
  this->_globalOptions = 1;
  *(undefined1 (*) [16])&this->_options = ZEXT816(0) << 0x20;
  *(undefined4 *)((long)&this->_inlineComment + 4) = 0;
  (this->_nativeGpReg).super_Operand.super_Operand_.field_0 =
       (anon_union_16_7_ed616b9d_for_Operand__0)(ZEXT816(0) << 0x20);
  this->_nativeGpArray = (Reg *)0x0;
  return 0;
}

Assistant:

Error CodeEmitter::onDetach(CodeHolder* code) noexcept {
  _codeInfo.reset();
  _finalized = false;
  _lastError = kErrorNotInitialized;

  _privateData = 0;
  _globalHints = 0;
  _globalOptions = kOptionMaybeFailureCase;

  _options = 0;
  _extraReg.reset();
  _inlineComment = nullptr;

  _nativeGpReg.reset();
  _nativeGpArray = nullptr;

  return kErrorOk;
}